

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan.c
# Opt level: O2

parasail_result_t *
parasail_sw_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t size;
  ulong size_00;
  size_t size_01;
  char *__format;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  int *local_68;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar8 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar8 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar8 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_004fc4d6:
      ppVar5 = parasail_result_new_rowcol1(_s1Len,s2Len);
      if (ppVar5 == (parasail_result_t *)0x0) {
        return (parasail_result_t *)0x0;
      }
      ppVar5->flag = ppVar5->flag | 0x1440204;
      size_00 = (ulong)(uint)s2Len;
      ptr = parasail_memalign_int(0x10,size_00);
      size = (size_t)(int)(_s1Len + 1);
      ptr_00 = parasail_memalign_int(0x10,size);
      size_01 = (size_t)_s1Len;
      ptr_01 = parasail_memalign_int(0x10,size_01);
      ptr_02 = parasail_memalign_int(0x10,size);
      ptr_03 = parasail_memalign_int(0x10,size);
      auVar11._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
      auVar11._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
      auVar11._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
      auVar11._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
      iVar4 = movmskps((int)ptr_03,auVar11);
      if (iVar4 != 0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (matrix->type == 0) {
        local_68 = parasail_memalign_int(0x10,size_01);
        uVar6 = 0;
        if (local_68 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        uVar7 = 0;
        if (0 < _s1Len) {
          uVar7 = (ulong)(uint)_s1Len;
        }
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          local_68[uVar6] = matrix->mapper[(byte)_s1[uVar6]];
        }
      }
      else {
        local_68 = (int *)0x0;
      }
      piVar2 = matrix->mapper;
      for (uVar6 = 0; size_00 != uVar6; uVar6 = uVar6 + 1) {
        ptr[uVar6] = piVar2[(byte)_s2[uVar6]];
      }
      *ptr_00 = 0;
      *ptr_02 = 0;
      uVar7 = 0;
      uVar6 = 0;
      if (0 < _s1Len) {
        uVar6 = (ulong)(uint)_s1Len;
      }
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        ptr_00[uVar7 + 1] = 0;
      }
      *ptr_03 = -0x40000000;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        ptr_01[uVar7] = -0x40000000;
      }
      uVar1 = s2Len - 1;
      iVar4 = -0x40000000;
      for (uVar7 = 0; uVar7 != size_00; uVar7 = uVar7 + 1) {
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          iVar10 = ptr_00[uVar9 + 1] - open;
          if (ptr_00[uVar9 + 1] - open < ptr_01[uVar9] - gap) {
            iVar10 = ptr_01[uVar9] - gap;
          }
          ptr_01[uVar9] = iVar10;
        }
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          if (matrix->type == 0) {
            iVar10 = local_68[uVar9];
          }
          else {
            iVar10 = (int)uVar9;
          }
          iVar10 = ptr_00[uVar9] + matrix->matrix[(long)(matrix->size * iVar10) + (long)ptr[uVar7]];
          if (iVar10 <= ptr_01[uVar9]) {
            iVar10 = ptr_01[uVar9];
          }
          ptr_02[uVar9 + 1] = iVar10;
        }
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          iVar10 = ptr_03[uVar9] - gap;
          if (ptr_03[uVar9] - gap <= ptr_02[uVar9]) {
            iVar10 = ptr_02[uVar9];
          }
          ptr_03[uVar9 + 1] = iVar10;
        }
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          iVar10 = ptr_03[uVar9 + 1] - open;
          if (ptr_03[uVar9 + 1] - open < ptr_02[uVar9 + 1]) {
            iVar10 = ptr_02[uVar9 + 1];
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          iVar3 = iVar4;
          if (iVar4 < iVar10) {
            iVar3 = iVar10;
          }
          if (iVar4 < iVar10) {
            _s1Len = (uint)uVar9;
          }
          ptr_00[uVar9 + 1] = iVar10;
          if (iVar4 < iVar10) {
            s2Len = (int)uVar7;
          }
          iVar4 = iVar3;
        }
        if (uVar7 == uVar1) {
          for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
            ((ppVar5->field_4).rowcols)->score_col[uVar9] = ptr_00[uVar9 + 1];
          }
        }
        ((ppVar5->field_4).rowcols)->score_row[uVar7] = ptr_00[size_01];
      }
      ppVar5->score = iVar4;
      ppVar5->end_query = _s1Len;
      ppVar5->end_ref = s2Len;
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      if (matrix->type == 0) {
        parasail_free(local_68);
        return ppVar5;
      }
      return ppVar5;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar8 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_004fc4d6;
      __format = "%s: %s must be > 0\n";
      pcVar8 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_rowcol_scan",pcVar8);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H  = NULL;
    int * restrict E  = NULL;
    int * restrict HtB= NULL;
    int * restrict Ht = NULL;
    int * restrict FtB= NULL;
    int * restrict Ft = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    FtB= parasail_memalign_int(16, s1Len+1);
    Ft = FtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!FtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = 0;
    }
    Ft[-1] = NEG_INF_32;

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        /* calculate Ft */
        for (i=0; i<s1Len; ++i) {
            Ft[i] = MAX(Ft[i-1]-gap, Ht[i-1]);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            H[i] = MAX(Ht[i], Ft[i]-open);
            H[i] = MAX(H[i], 0);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
            if (H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->rowcols->score_col[i] = H[i];
            }
        }
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(FtB);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}